

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdFreeTaprootScriptTreeHandle(void *handle,void *tree_handle)

{
  void *pvVar1;
  long in_RSI;
  string *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  CfdCapiTapscriptTree *data;
  int result;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *in_stack_ffffffffffffff40;
  allocator *paVar2;
  allocator local_81;
  string local_80 [4];
  uint32_t in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  long local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"TapscriptTree",&local_51);
    cfd::capi::CheckBuffer(except,in_stack_00000038);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (*(long *)(local_18 + 0x10) != 0) {
      pvVar1 = *(void **)(local_18 + 0x10);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
        ~vector((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                 *)in_stack_ffffffffffffff40);
        operator_delete(pvVar1,0x18);
      }
      *(undefined8 *)(local_18 + 0x10) = 0;
    }
    if (*(long *)(local_18 + 0x18) != 0) {
      pvVar1 = *(void **)(local_18 + 0x18);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                  (in_stack_ffffffffffffff40);
        operator_delete(pvVar1,0x18);
      }
      *(undefined8 *)(local_18 + 0x18) = 0;
    }
    paVar2 = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"TapscriptTree",paVar2);
    cfd::capi::FreeBuffer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return 0;
}

Assistant:

int CfdFreeTaprootScriptTreeHandle(void* handle, void* tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (tree_handle != nullptr) {
      CheckBuffer(tree_handle, kPrefixTapscriptTree);
      CfdCapiTapscriptTree* data =
          static_cast<CfdCapiTapscriptTree*>(tree_handle);
      if (data->tree_buffer != nullptr) {
        delete data->tree_buffer;
        data->tree_buffer = nullptr;
      }
      if (data->branch_buffer != nullptr) {
        delete data->branch_buffer;
        data->branch_buffer = nullptr;
      }
      FreeBuffer(
          tree_handle, kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}